

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piecewise_const_element_matrix_provider.cc
# Opt level: O0

MatrixXd * __thiscall
projects::ipdg_stokes::assemble::PiecewiseConstElementMatrixProvider::Eval
          (MatrixXd *__return_storage_ptr__,PiecewiseConstElementMatrixProvider *this,Entity *entity
          )

{
  element_type pEVar1;
  Index IVar2;
  int iVar3;
  undefined4 extraout_var;
  MatrixXd *pMVar5;
  undefined4 extraout_var_00;
  CoeffReturnType pdVar6;
  Scalar *pSVar7;
  reference ppEVar8;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Scalar SVar9;
  double dVar10;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  PVar11;
  Entity *edge;
  undefined1 local_460 [4];
  int edge_idx_1;
  Type local_428;
  TransposeReturnType local_3f0;
  ColXpr local_3b8;
  TransposeReturnType local_388;
  Product<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true>_>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>
  local_358;
  double local_320;
  CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> local_318;
  undefined1 local_2f8 [8];
  Vector2d t;
  int local_2e0;
  int local_2dc;
  int edge_idx;
  int basis_func_idx;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> edges;
  ConstantReturnType local_290;
  undefined1 local_271;
  ConstRowXpr local_270;
  NegativeReturnType local_240;
  ConstRowXpr local_208;
  CommaInitializer<Eigen::Matrix<double,_2,_3,_0,_2,_3>_> local_1d8;
  undefined1 local_1b8 [8];
  Matrix<double,_2,_3,_0,_2,_3> basis_funct;
  Matrix<double,2,3,0,2,3> local_178 [8];
  Matrix<double,_2,_3,_0,_2,_3> grads;
  ConstantReturnType local_140;
  Matrix<double,__1,__1,_0,__1,__1> local_128;
  undefined1 local_110 [8];
  MatrixXd J_inv_trans;
  MatrixXd local_e0;
  Matrix<double,__1,__1,_0,__1,__1> local_c8;
  non_const_type local_b0;
  undefined1 local_a8 [8];
  MatrixXd ref_grads;
  FeLagrangeO1Tria<double> hat_func;
  undefined1 local_78 [8];
  Matrix<double,_2,_3,_0,_2,_3> normals;
  undefined1 local_40 [8];
  MatrixXd vertices;
  Geometry *geom;
  Entity *entity_local;
  PiecewiseConstElementMatrixProvider *this_local;
  MatrixXd *elem_mat;
  long *plVar4;
  
  iVar3 = (*entity->_vptr_Entity[3])();
  plVar4 = (long *)CONCAT44(extraout_var,iVar3);
  vertices.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       (Index)plVar4;
  iVar3 = (*entity->_vptr_Entity[4])();
  normals.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.m_data.array[5].
  _7_1_ = (undefined1)iVar3;
  pMVar5 = lf::base::RefEl::NodeCoords
                     ((RefEl *)((long)normals.
                                      super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.
                                      m_storage.m_data.array + 0x2f));
  (**(code **)(*plVar4 + 0x18))(local_40,plVar4,pMVar5);
  ipdg_stokes::mesh::computeOutwardNormals((Matrix<double,_2,_3,_0,_2,_3> *)local_78,entity);
  lf::uscalfe::FeLagrangeO1Tria<double>::FeLagrangeO1Tria
            ((FeLagrangeO1Tria<double> *)
             &ref_grads.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero
            ((ConstantReturnType *)
             &J_inv_trans.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
              .m_cols,2);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_e0,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&J_inv_trans.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_cols);
  lf::uscalfe::FeLagrangeO1Tria<double>::GradientsReferenceShapeFunctions
            (&local_c8,
             (FeLagrangeO1Tria<double> *)
             &ref_grads.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols,&local_e0);
  local_b0 = (non_const_type)
             Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                       ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_c8);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_a8,
             (EigenBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)&local_b0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_c8);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_e0);
  IVar2 = vertices.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
  ;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero(&local_140,2);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_128,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_140);
  (**(code **)(*(long *)IVar2 + 0x28))(local_110,IVar2,&local_128);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_128);
  PVar11 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                     ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_110,
                      (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_a8);
  basis_funct.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.m_data.array[5]
       = (double)PVar11.m_lhs;
  Eigen::Matrix<double,2,3,0,2,3>::
  Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
            (local_178,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
              *)(basis_funct.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.
                 m_data.array + 5));
  Eigen::Matrix<double,_2,_3,_0,_2,_3>::Matrix((Matrix<double,_2,_3,_0,_2,_3> *)local_1b8);
  Eigen::DenseBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>::row
            (&local_208,(DenseBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_> *)local_178,1);
  Eigen::DenseBase<Eigen::Matrix<double,2,3,0,2,3>>::operator<<
            (&local_1d8,(DenseBase<Eigen::Matrix<double,2,3,0,2,3>> *)local_1b8,
             (DenseBase<Eigen::Block<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_1,_3,_false>_> *)
             &local_208);
  Eigen::DenseBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>::row
            (&local_270,(DenseBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_> *)local_178,0);
  Eigen::DenseBase<Eigen::Block<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_1,_3,_false>_>::
  operator-(&local_240,
            (DenseBase<Eigen::Block<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_1,_3,_false>_> *)
            &local_270);
  Eigen::CommaInitializer<Eigen::Matrix<double,2,3,0,2,3>>::operator_
            ((CommaInitializer<Eigen::Matrix<double,2,3,0,2,3>> *)&local_1d8,
             (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_1,_3,_false>_>_>
              *)&local_240);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>::~CommaInitializer(&local_1d8);
  local_271 = 0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero(&local_290,6,6);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_290);
  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,int>
            ((Type *)&edges._M_extent,
             (DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)__return_storage_ptr__,0,0,3,3);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::setZero
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
             &edges._M_extent);
  iVar3 = (*entity->_vptr_Entity[1])(entity,1);
  _edge_idx = (pointer)CONCAT44(extraout_var_00,iVar3);
  for (local_2dc = 0; local_2dc < 3; local_2dc = local_2dc + 1) {
    for (local_2e0 = 0; local_2e0 < 3; local_2e0 = local_2e0 + 1) {
      Eigen::Matrix<double,_2,_1,_0,_2,_1>::Matrix((Matrix<double,_2,_1,_0,_2,_1> *)local_2f8);
      pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>,_0> *)local_78,1,
                          (long)local_2e0);
      local_320 = -*pdVar6;
      Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator<<
                (&local_318,(DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_2f8,&local_320
                );
      pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>,_0> *)local_78,0,
                          (long)local_2e0);
      Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator_(&local_318,pdVar6);
      Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::~CommaInitializer(&local_318);
      Eigen::DenseBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>::col
                (&local_3b8,(DenseBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_> *)local_1b8,
                 (long)local_2dc);
      Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true>_>::transpose
                (&local_388,
                 (DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true>_> *)
                 &local_3b8);
      Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,2,3,0,2,3>,2,1,true>>>::
      operator*(&local_358,
                (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,2,3,0,2,3>,2,1,true>>>
                 *)&local_388,(MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_2f8);
      SVar9 = Eigen::internal::dense_product_base::operator_cast_to_double
                        ((dense_product_base *)&local_358);
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                          __return_storage_ptr__,(long)(local_2e0 + 3),(long)local_2dc);
      *pSVar7 = SVar9;
    }
  }
  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,int>
            (&local_428,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)__return_storage_ptr__,3,0
             ,3,3);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
  transpose(&local_3f0,
            (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
            &local_428);
  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,int>
            ((Type *)local_460,
             (DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)__return_storage_ptr__,0,3,3,3);
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false> *)local_460,
             (DenseBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>_>
              *)&local_3f0);
  for (edge._4_4_ = 0; edge._4_4_ < 3; edge._4_4_ = edge._4_4_ + 1) {
    ppEVar8 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::operator[]
                        ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&edge_idx,
                         (long)edge._4_4_);
    pEVar1 = *ppEVar8;
    dVar10 = this->sigma_;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        __return_storage_ptr__,(long)(edge._4_4_ + 3),(long)(edge._4_4_ + 3));
    *pSVar7 = -1.0 / dVar10;
    if ((this->modified_ & 1U) != 0) {
      iVar3 = (*pEVar1->_vptr_Entity[3])();
      dVar10 = lf::geometry::Volume((Geometry *)CONCAT44(extraout_var_01,iVar3));
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                          __return_storage_ptr__,(long)(edge._4_4_ + 3),(long)(edge._4_4_ + 3));
      *pSVar7 = *pSVar7 / dVar10;
    }
    iVar3 = (**this->boundary_->_vptr_MeshDataSet)(this->boundary_,pEVar1);
    if ((*(byte *)CONCAT44(extraout_var_02,iVar3) & 1) == 0) {
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                          __return_storage_ptr__,(long)(edge._4_4_ + 3),(long)(edge._4_4_ + 3));
      *pSVar7 = *pSVar7 / 2.0;
    }
  }
  local_271 = 1;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_110);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_a8);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

Eigen::MatrixXd PiecewiseConstElementMatrixProvider::Eval(
    const lf::mesh::Entity &entity) const {
  // Get the geometry of the entity
  const auto *geom = entity.Geometry();
  // Compute the global vertex coordinates
  const Eigen::MatrixXd vertices = geom->Global(entity.RefEl().NodeCoords());
  // Use the vertex coordinates to compute the local normals on the edges
  const Eigen::Matrix<double, 2, 3> normals =
      projects::ipdg_stokes::mesh::computeOutwardNormals(entity);
  // Construct the basis functions from the curl of the standard hat functions
  const lf::uscalfe::FeLagrangeO1Tria<double> hat_func;
  const Eigen::MatrixXd ref_grads =
      hat_func.GradientsReferenceShapeFunctions(Eigen::VectorXd::Zero(2))
          .transpose();
  const Eigen::MatrixXd J_inv_trans =
      geom->JacobianInverseGramian(Eigen::VectorXd::Zero(2));
  const Eigen::Matrix<double, 2, 3> grads = J_inv_trans * ref_grads;
  Eigen::Matrix<double, 2, 3> basis_funct;
  basis_funct << grads.row(1), -grads.row(0);
  // Fill the element matrix
  Eigen::MatrixXd elem_mat = Eigen::MatrixXd::Zero(6, 6);
  // Upper left block
  elem_mat.block(0, 0, 3, 3).setZero();
  // Lower left and upper right blocks
  const auto edges = entity.SubEntities(1);
  for (int basis_func_idx = 0; basis_func_idx < 3; ++basis_func_idx) {
    for (int edge_idx = 0; edge_idx < 3; ++edge_idx) {
      Eigen::Vector2d t;
      t << -normals(1, edge_idx), normals(0, edge_idx);
      elem_mat(edge_idx + 3, basis_func_idx) =
          basis_funct.col(basis_func_idx).transpose() * t;
    }
  }
  elem_mat.block(0, 3, 3, 3) = elem_mat.block(3, 0, 3, 3).transpose();
  // Lower right block
  for (int edge_idx = 0; edge_idx < 3; ++edge_idx) {
    const auto &edge = *edges[edge_idx];
    elem_mat(edge_idx + 3, edge_idx + 3) = -1 / sigma_;
    if (modified_) {
      elem_mat(edge_idx + 3, edge_idx + 3) /=
          lf::geometry::Volume(*(edge.Geometry()));
    }
    // If the edge is not on the boundary, the entry in the full system matrix
    // will be the sum of two entries of element matrices but we want it still
    // to be equal to 1/sigma. For this reason, we divide the local contribution
    // by 2
    if (!boundary_(edge)) {
      elem_mat(edge_idx + 3, edge_idx + 3) /= 2;
    }
  }
  return elem_mat;
}